

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_pages.c
# Opt level: O2

HPDF_ExData HPDF_Page_Create3DAnnotExData(HPDF_Page page)

{
  HPDF_BOOL HVar1;
  HPDF_ExData p_Var2;
  
  HVar1 = HPDF_Page_Validate(page);
  if (HVar1 != 0) {
    p_Var2 = HPDF_3DAnnotExData_New(page->mmgr,*(HPDF_Xref *)((long)page->attr + 0x78));
    if (p_Var2 != (HPDF_ExData)0x0) {
      return p_Var2;
    }
    HPDF_CheckError(page->error);
  }
  return (HPDF_ExData)0x0;
}

Assistant:

HPDF_EXPORT(HPDF_ExData)
HPDF_Page_Create3DAnnotExData(HPDF_Page page)
{
    HPDF_PageAttr attr;
    HPDF_Annotation exData;

    HPDF_PTRACE((" HPDF_Page_Create3DAnnotExData\n"));

    if (!HPDF_Page_Validate (page))
        return NULL;

    attr = (HPDF_PageAttr)page->attr;

    exData = HPDF_3DAnnotExData_New(page->mmgr, attr->xref);
    if ( !exData)
        HPDF_CheckError (page->error);

    return exData;
}